

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O2

void __thiscall
cmTestGenerator::GenerateScriptForConfig
          (cmTestGenerator *this,ostream *os,string *config,Indent indent)

{
  cmTest *pcVar1;
  TargetType TVar2;
  cmListFileBacktrace *backtrace;
  ostream *poVar3;
  cmGeneratorTarget *this_00;
  char *pcVar4;
  _Base_ptr p_Var5;
  pointer pbVar6;
  string *str;
  allocator local_109;
  ostream *local_108;
  string emulatorExe;
  undefined1 local_e0 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emulatorWithArgs;
  string local_98;
  string exe;
  cmGeneratorExpression ge;
  
  this->TestGenerated = true;
  local_e0._16_8_ = config;
  backtrace = cmTest::GetBacktrace(this->Test);
  cmGeneratorExpression::cmGeneratorExpression(&ge,backtrace);
  local_108 = os;
  poVar3 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
  poVar3 = std::operator<<(poVar3,"add_test(");
  std::__cxx11::string::string((string *)&exe,(string *)&this->Test->Name);
  poVar3 = std::operator<<(poVar3,(string *)&exe);
  std::operator<<(poVar3," ");
  std::__cxx11::string::~string((string *)&exe);
  pcVar1 = this->Test;
  std::__cxx11::string::string
            ((string *)&exe,
             (string *)
             (pcVar1->Command).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  local_e0._8_8_ = this;
  this_00 = cmLocalGenerator::FindGeneratorTargetToUse(this->LG,&exe);
  if (this_00 != (cmGeneratorTarget *)0x0) {
    TVar2 = cmGeneratorTarget::GetType(this_00);
    if (TVar2 == EXECUTABLE) {
      cmGeneratorTarget::GetFullPath
                (&emulatorExe,this_00,(string *)local_e0._16_8_,RuntimeBinaryArtifact,false);
      std::__cxx11::string::operator=((string *)&exe,(string *)&emulatorExe);
      std::__cxx11::string::~string((string *)&emulatorExe);
      std::__cxx11::string::string
                ((string *)&emulatorExe,"CROSSCOMPILING_EMULATOR",(allocator *)&local_98);
      pcVar4 = cmGeneratorTarget::GetProperty(this_00,&emulatorExe);
      std::__cxx11::string::~string((string *)&emulatorExe);
      if (pcVar4 != (char *)0x0) {
        emulatorWithArgs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        emulatorWithArgs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        emulatorWithArgs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__cxx11::string::string((string *)&emulatorExe,pcVar4,(allocator *)&local_98);
        cmSystemTools::ExpandListArgument(&emulatorExe,&emulatorWithArgs,false);
        std::__cxx11::string::~string((string *)&emulatorExe);
        std::__cxx11::string::string
                  ((string *)&emulatorExe,
                   (string *)
                   emulatorWithArgs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        cmsys::SystemTools::ConvertToUnixSlashes(&emulatorExe);
        cmOutputConverter::EscapeForCMake(&local_98,&emulatorExe);
        poVar3 = std::operator<<(local_108,(string *)&local_98);
        std::operator<<(poVar3," ");
        std::__cxx11::string::~string((string *)&local_98);
        str = emulatorWithArgs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
        while (str = str + 1,
              str != emulatorWithArgs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) {
          cmOutputConverter::EscapeForCMake(&local_98,str);
          poVar3 = std::operator<<(local_108,(string *)&local_98);
          std::operator<<(poVar3," ");
          std::__cxx11::string::~string((string *)&local_98);
        }
        std::__cxx11::string::~string((string *)&emulatorExe);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&emulatorWithArgs);
      }
      goto LAB_003ef8a3;
    }
  }
  cmGeneratorExpression::Parse((cmGeneratorExpression *)&local_98,(char *)&ge);
  emulatorExe._M_dataplus._M_p = (pointer)&emulatorExe.field_2;
  emulatorExe._M_string_length = 0;
  emulatorExe.field_2._M_local_buf[0] = '\0';
  cmCompiledGeneratorExpression::Evaluate
            ((cmCompiledGeneratorExpression *)local_98._M_dataplus._M_p,
             *(cmLocalGenerator **)(local_e0._8_8_ + 0x70),(string *)local_e0._16_8_,false,
             (cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
             (cmGeneratorExpressionDAGChecker *)0x0,&emulatorExe);
  std::__cxx11::string::assign((char *)&exe);
  std::__cxx11::string::~string((string *)&emulatorExe);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)&local_98);
  cmsys::SystemTools::ConvertToUnixSlashes(&exe);
LAB_003ef8a3:
  cmOutputConverter::EscapeForCMake(&emulatorExe,&exe);
  std::operator<<(local_108,(string *)&emulatorExe);
  std::__cxx11::string::~string((string *)&emulatorExe);
  pbVar6 = (pcVar1->Command).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while (pbVar6 = pbVar6 + 1,
        pbVar6 != (pcVar1->Command).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
    poVar3 = std::operator<<(local_108," ");
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_e0,(string *)&ge);
    emulatorWithArgs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&emulatorWithArgs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    emulatorWithArgs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    emulatorWithArgs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)emulatorWithArgs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
    pcVar4 = cmCompiledGeneratorExpression::Evaluate
                       ((cmCompiledGeneratorExpression *)local_e0._0_8_,
                        *(cmLocalGenerator **)(local_e0._8_8_ + 0x70),(string *)local_e0._16_8_,
                        false,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                        (cmGeneratorExpressionDAGChecker *)0x0,(string *)&emulatorWithArgs);
    std::__cxx11::string::string((string *)&local_98,pcVar4,&local_109);
    cmOutputConverter::EscapeForCMake(&emulatorExe,&local_98);
    std::operator<<(poVar3,(string *)&emulatorExe);
    std::__cxx11::string::~string((string *)&emulatorExe);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&emulatorWithArgs);
    ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)local_e0);
  }
  std::operator<<(local_108,")\n");
  pcVar1 = *(cmTest **)(local_e0._8_8_ + 0x78);
  if ((pcVar1->Properties).
      super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
      ._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    poVar3 = operator<<(local_108,(cmScriptGeneratorIndent)indent.Level);
    poVar3 = std::operator<<(poVar3,"set_tests_properties(");
    std::__cxx11::string::string
              ((string *)&emulatorExe,(string *)&(*(cmTest **)(local_e0._8_8_ + 0x78))->Name);
    poVar3 = std::operator<<(poVar3,(string *)&emulatorExe);
    std::operator<<(poVar3," PROPERTIES ");
    std::__cxx11::string::~string((string *)&emulatorExe);
    for (p_Var5 = (pcVar1->Properties).
                  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 !=
        &(pcVar1->Properties).
         super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
         ._M_t._M_impl.super__Rb_tree_header; p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      poVar3 = std::operator<<(local_108," ");
      poVar3 = std::operator<<(poVar3,(string *)(p_Var5 + 1));
      poVar3 = std::operator<<(poVar3," ");
      cmProperty::GetValue((cmProperty *)(p_Var5 + 2));
      cmGeneratorExpression::Parse((cmGeneratorExpression *)local_e0,(char *)&ge);
      emulatorWithArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&emulatorWithArgs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      emulatorWithArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      emulatorWithArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((ulong)emulatorWithArgs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00)
      ;
      pcVar4 = cmCompiledGeneratorExpression::Evaluate
                         ((cmCompiledGeneratorExpression *)local_e0._0_8_,
                          *(cmLocalGenerator **)(local_e0._8_8_ + 0x70),(string *)local_e0._16_8_,
                          false,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                          (cmGeneratorExpressionDAGChecker *)0x0,(string *)&emulatorWithArgs);
      std::__cxx11::string::string((string *)&local_98,pcVar4,&local_109);
      cmOutputConverter::EscapeForCMake(&emulatorExe,&local_98);
      std::operator<<(poVar3,(string *)&emulatorExe);
      std::__cxx11::string::~string((string *)&emulatorExe);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&emulatorWithArgs);
      ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                ((auto_ptr<cmCompiledGeneratorExpression> *)local_e0);
    }
    poVar3 = std::operator<<(local_108,")");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::__cxx11::string::~string((string *)&exe);
  cmGeneratorExpression::~cmGeneratorExpression(&ge);
  return;
}

Assistant:

void cmTestGenerator::GenerateScriptForConfig(std::ostream& os,
                                              const std::string& config,
                                              Indent indent)
{
  this->TestGenerated = true;

  // Set up generator expression evaluation context.
  cmGeneratorExpression ge(this->Test->GetBacktrace());

  // Start the test command.
  os << indent << "add_test(" << this->Test->GetName() << " ";

  // Get the test command line to be executed.
  std::vector<std::string> const& command = this->Test->GetCommand();

  // Check whether the command executable is a target whose name is to
  // be translated.
  std::string exe = command[0];
  cmGeneratorTarget* target = this->LG->FindGeneratorTargetToUse(exe);
  if (target && target->GetType() == cmStateEnums::EXECUTABLE) {
    // Use the target file on disk.
    exe = target->GetFullPath(config);

    // Prepend with the emulator when cross compiling if required.
    const char* emulator = target->GetProperty("CROSSCOMPILING_EMULATOR");
    if (emulator != CM_NULLPTR) {
      std::vector<std::string> emulatorWithArgs;
      cmSystemTools::ExpandListArgument(emulator, emulatorWithArgs);
      std::string emulatorExe(emulatorWithArgs[0]);
      cmSystemTools::ConvertToUnixSlashes(emulatorExe);
      os << cmOutputConverter::EscapeForCMake(emulatorExe) << " ";
      for (std::vector<std::string>::const_iterator ei =
             emulatorWithArgs.begin() + 1;
           ei != emulatorWithArgs.end(); ++ei) {
        os << cmOutputConverter::EscapeForCMake(*ei) << " ";
      }
    }
  } else {
    // Use the command name given.
    exe = ge.Parse(exe.c_str())->Evaluate(this->LG, config);
    cmSystemTools::ConvertToUnixSlashes(exe);
  }

  // Generate the command line with full escapes.
  os << cmOutputConverter::EscapeForCMake(exe);
  for (std::vector<std::string>::const_iterator ci = command.begin() + 1;
       ci != command.end(); ++ci) {
    os << " " << cmOutputConverter::EscapeForCMake(
                   ge.Parse(*ci)->Evaluate(this->LG, config));
  }

  // Finish the test command.
  os << ")\n";

  // Output properties for the test.
  cmPropertyMap& pm = this->Test->GetProperties();
  if (!pm.empty()) {
    os << indent << "set_tests_properties(" << this->Test->GetName()
       << " PROPERTIES ";
    for (cmPropertyMap::const_iterator i = pm.begin(); i != pm.end(); ++i) {
      os << " " << i->first << " "
         << cmOutputConverter::EscapeForCMake(
              ge.Parse(i->second.GetValue())->Evaluate(this->LG, config));
    }
    os << ")" << std::endl;
  }
}